

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSParser::composePlayList(MPLSParser *this,BitStreamWriter *writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  MPLSStreamInfo *pMVar6;
  size_type sVar7;
  MPLSStreamInfo *pMVar8;
  ulong local_48;
  size_t SubPath_id;
  MPLSStreamInfo *dependStreamInfo;
  size_t PlayItem_id;
  MPLSStreamInfo *mainStreamInfo;
  int beforeCount;
  uint32_t *lengthPos;
  BitStreamWriter *writer_local;
  MPLSParser *this_local;
  
  puVar5 = BitStream::getBuffer(&writer->super_BitStream);
  iVar1 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,0x20,0);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,0x10,0);
  pMVar6 = getMainStream(this);
  sVar7 = std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::size(&(pMVar6->super_M2TSStreamInfo).m_index);
  BitStreamWriter::putBits(writer,0x10,(uint)sVar7);
  BitStreamWriter::putBits(writer,0x10,this->number_of_SubPaths);
  dependStreamInfo = (MPLSStreamInfo *)0x0;
  while( true ) {
    pMVar8 = (MPLSStreamInfo *)
             std::
             vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ::size(&(pMVar6->super_M2TSStreamInfo).m_index);
    if (pMVar8 <= dependStreamInfo) break;
    composePlayItem(this,writer,(size_t)dependStreamInfo,&(pMVar6->super_M2TSStreamInfo).m_index);
    dependStreamInfo =
         (MPLSStreamInfo *)((long)&(dependStreamInfo->super_M2TSStreamInfo).streamPID + 1);
  }
  local_48 = 0;
  while( true ) {
    iVar3 = this->number_of_SubPaths;
    sVar7 = std::
            vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
            ::size(&(pMVar6->super_M2TSStreamInfo).m_index);
    if ((long)iVar3 * sVar7 <= local_48) break;
    composeSubPath(this,writer,local_48,&(pMVar6->super_M2TSStreamInfo).m_index,this->subPath_type);
    local_48 = local_48 + 1;
  }
  iVar3 = BitStreamWriter::getBitsCount(writer);
  uVar4 = my_ntohl(iVar3 / 8 - iVar2 / 8);
  *(uint32_t *)(puVar5 + iVar1 / 8) = uVar4;
  return;
}

Assistant:

void MPLSParser::composePlayList(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    writer.putBits(16, 0);  // reserved_for_future_use
    const MPLSStreamInfo& mainStreamInfo = getMainStream();
    writer.putBits(16, static_cast<unsigned>(mainStreamInfo.m_index.size()));  // number_of_PlayItems
    writer.putBits(16, number_of_SubPaths);                                    // number_of_SubPaths
    // connection_condition = 1;
    for (size_t PlayItem_id = 0; PlayItem_id < mainStreamInfo.m_index.size(); PlayItem_id++)
    {
        composePlayItem(writer, PlayItem_id, mainStreamInfo.m_index);
        // connection_condition = 6;
    }

    const MPLSStreamInfo& dependStreamInfo = mainStreamInfo;

    for (size_t SubPath_id = 0; SubPath_id < number_of_SubPaths * dependStreamInfo.m_index.size(); SubPath_id++)
    {
        composeSubPath(writer, SubPath_id, dependStreamInfo.m_index, subPath_type);  // pip
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}